

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d8.cpp
# Opt level: O3

Stream * rw::d3d8::writeNativeData
                   (Stream *stream,int32 len,void *object,int32 param_4,int32 param_5)

{
  short sVar1;
  long lVar2;
  int32 iVar3;
  undefined2 *puVar4;
  uint16 *puVar5;
  uint8 *puVar6;
  undefined4 *puVar7;
  undefined4 *puVar8;
  undefined8 *puVar9;
  uint uVar10;
  long lVar11;
  
  writeChunkHeader(stream,1,len + -0xc);
  if ((*(int **)((long)object + 0x98) != (int *)0x0) && (**(int **)((long)object + 0x98) == 8)) {
    Stream::writeU32(stream,8);
    lVar2 = *(long *)((long)object + 0x98);
    lVar11 = (ulong)*(ushort *)(*(long *)((long)object + 0x90) + 4) * 0x2c + 4;
    allocLocation =
         "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/d3d/d3d8.cpp line: 181"
    ;
    puVar4 = (undefined2 *)(*DAT_0014ada8)(lVar11,0x1000f);
    Stream::writeI32(stream,(int32)lVar11);
    *puVar4 = *(undefined2 *)(lVar2 + 4);
    sVar1 = *(short *)(lVar2 + 6);
    puVar4[1] = sVar1;
    if (sVar1 != 0) {
      puVar7 = *(undefined4 **)(lVar2 + 8);
      puVar8 = (undefined4 *)(puVar4 + 2);
      uVar10 = 0;
      do {
        *puVar8 = *puVar7;
        puVar8[1] = puVar7[1];
        puVar8[2] = puVar7[2];
        puVar8[3] = puVar7[3];
        iVar3 = MaterialList::findIndex
                          ((MaterialList *)((long)object + 0x80),*(Material **)(puVar7 + 4));
        puVar8[4] = iVar3;
        puVar8[5] = puVar7[6];
        puVar8[6] = puVar7[7];
        *(undefined8 *)(puVar8 + 7) = 0;
        puVar8[9] = puVar7[0xc];
        *(undefined1 *)(puVar8 + 10) = *(undefined1 *)(puVar7 + 0xd);
        *(undefined1 *)((long)puVar8 + 0x29) = *(undefined1 *)((long)puVar7 + 0x35);
        *(undefined1 *)((long)puVar8 + 0x2a) = *(undefined1 *)((long)puVar7 + 0x36);
        puVar7 = puVar7 + 0xe;
        uVar10 = uVar10 + 1;
        puVar8 = (undefined4 *)((long)puVar8 + 0x2b);
      } while (uVar10 < *(ushort *)(lVar2 + 6));
    }
    (*stream->_vptr_Stream[3])(stream,puVar4,lVar11);
    (*DAT_0014ada0)(puVar4);
    if (*(short *)(lVar2 + 6) != 0) {
      puVar9 = (undefined8 *)(*(long *)(lVar2 + 8) + 0x28);
      uVar10 = 0;
      do {
        puVar5 = d3d::lockIndices((void *)puVar9[-1],0,0,0);
        (*stream->_vptr_Stream[3])(stream,puVar5,(ulong)(uint)(*(int *)((long)puVar9 + -0x1c) * 2));
        d3d::unlockIndices((void *)puVar9[-1]);
        puVar6 = d3d::lockVertices((void *)*puVar9,0,0,0);
        (*stream->_vptr_Stream[3])
                  (stream,puVar6,
                   (ulong)(uint)(*(int *)(puVar9 + -4) * *(int *)((long)puVar9 + -0x24)));
        d3d::unlockVertices((void *)*puVar9);
        uVar10 = uVar10 + 1;
        puVar9 = puVar9 + 7;
      } while (uVar10 < *(ushort *)(lVar2 + 6));
    }
  }
  return stream;
}

Assistant:

Stream*
writeNativeData(Stream *stream, int32 len, void *object, int32, int32)
{
	ASSERTLITTLE;
	Geometry *geometry = (Geometry*)object;
	writeChunkHeader(stream, ID_STRUCT, len-12);
	if(geometry->instData == nil ||
	   geometry->instData->platform != PLATFORM_D3D8)
		return stream;
	stream->writeU32(PLATFORM_D3D8);
	InstanceDataHeader *header = (InstanceDataHeader*)geometry->instData;

	int32 size = 4 + geometry->meshHeader->numMeshes*0x2C;
	uint8 *data = rwNewT(uint8, size, MEMDUR_FUNCTION | ID_GEOMETRY);
	stream->writeI32(size);
	uint8 *p = data;
	*(uint16*)p = header->serialNumber; p += 2;
	*(uint16*)p = header->numMeshes; p += 2;

	InstanceData *inst = header->inst;
	for(uint32 i = 0; i < header->numMeshes; i++){
		*(uint32*)p = inst->minVert; p += 4;
		*(uint32*)p = inst->stride; p += 4;
		*(uint32*)p = inst->numVertices; p += 4;
		*(uint32*)p = inst->numIndices; p += 4;
		int32 matid = geometry->matList.findIndex(inst->material);
		*(int32*)p = matid; p += 4;
		*(uint32*)p = inst->vertexShader; p += 4;
		*(uint32*)p = inst->primType; p += 4;
		*(uint32*)p = 0; p += 4;		// index buffer
		*(uint32*)p = 0; p += 4;		// vertex buffer
		*(uint32*)p = inst->baseIndex; p += 4;
		*p++ = inst->vertexAlpha;
		*p++ = inst->managed;
		*p++ = inst->remapped;
		inst++;
	}
	stream->write8(data, size);
	rwFree(data);

	inst = header->inst;
	for(uint32 i = 0; i < header->numMeshes; i++){
		uint16 *indices = lockIndices(inst->indexBuffer, 0, 0, 0);
		stream->write8(indices, 2*inst->numIndices);
		unlockIndices(inst->indexBuffer);

		uint8 *verts = lockVertices(inst->vertexBuffer, 0, 0, D3DLOCK_NOSYSLOCK);
		stream->write8(verts, inst->stride*inst->numVertices);
		unlockVertices(inst->vertexBuffer);
		inst++;
	}
	return stream;
}